

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGMSHReadMesh.cpp
# Opt level: O0

void __thiscall
TPZGMSHReadMesh::ReadMesh3D
          (TPZGMSHReadMesh *this,char *meshfile,TPZStack<TPZGeoEl_*,_10> *elemlist,
          TPZStack<TPZGeoElSide,_10> *elembclist)

{
  long lVar1;
  double *pdVar2;
  void *pvVar3;
  long *plVar4;
  TPZGeoMesh *in_RDX;
  char *in_RSI;
  long in_RDI;
  TPZVec<long> nos;
  int64_t nvert;
  int64_t fgt2;
  int64_t nmat;
  int64_t fgt1;
  int64_t numb;
  int64_t index;
  TPZVec<long> nodes;
  int64_t numelem;
  int64_t i;
  TPZVec<double> coord;
  int64_t number;
  int64_t nnodes;
  char title [256];
  ifstream mesh;
  TPZStack<long,_10> Indexes;
  char *in_stack_fffffffffffffa38;
  TPZGeoMesh *in_stack_fffffffffffffa40;
  TPZGeoEl *in_stack_fffffffffffffa48;
  TPZGeoNode *in_stack_fffffffffffffa50;
  int64_t in_stack_fffffffffffffa58;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffa60;
  long *in_stack_fffffffffffffa68;
  TPZGeoMesh *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffac8;
  int newsize;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffad0;
  TPZVec<long> local_458;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  undefined1 local_410 [8];
  TPZVec<long> local_408;
  long local_3e8;
  long local_3e0;
  TPZVec<double> local_3d8;
  long local_3b8;
  long local_3b0 [33];
  undefined1 local_2a8 [88];
  char *in_stack_fffffffffffffdb0;
  TPZStack<long,_10> *in_stack_fffffffffffffdb8;
  TPZGMSHReadMesh *in_stack_fffffffffffffdc0;
  TPZVec<long> local_90 [3];
  TPZGeoMesh *local_18;
  char *local_10;
  
  newsize = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffa50);
  Resequence(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::ifstream::ifstream(local_2a8,local_10,_S_in);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa40,
                  in_stack_fffffffffffffa38);
  std::istream::operator>>(local_2a8,local_3b0);
  TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x208));
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(in_stack_fffffffffffffad0,newsize);
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)in_stack_fffffffffffffa40,(int64_t)in_stack_fffffffffffffa38);
  for (local_3e0 = 0; local_3e0 < local_3b0[0]; local_3e0 = local_3e0 + 1) {
    std::istream::operator>>(local_2a8,&local_3b8);
    pdVar2 = TPZVec<double>::operator[](&local_3d8,0);
    pvVar3 = (void *)std::istream::operator>>(local_2a8,pdVar2);
    pdVar2 = TPZVec<double>::operator[](&local_3d8,1);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,pdVar2);
    pdVar2 = TPZVec<double>::operator[](&local_3d8,2);
    std::istream::operator>>(pvVar3,pdVar2);
    TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x208));
    TPZChunkVector<TPZGeoNode,_10>::operator[](in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    TPZGeoNode::Initialize
              (in_stack_fffffffffffffa50,(TPZVec<double> *)in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
  }
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa40,
                  in_stack_fffffffffffffa38);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa40,
                  in_stack_fffffffffffffa38);
  std::istream::operator>>(local_2a8,&local_3e8);
  TPZVec<long>::TPZVec(&local_408);
  TPZVec<long>::Resize((TPZVec<long> *)in_stack_fffffffffffffa70,(int64_t)in_stack_fffffffffffffa68)
  ;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffa40,(int64_t)in_stack_fffffffffffffa38)
  ;
  for (local_3e0 = 0; local_3e0 < local_3e8; local_3e0 = local_3e0 + 1) {
    pvVar3 = (void *)std::istream::operator>>(local_2a8,&local_418);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,&local_420);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,&local_428);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,&local_430);
    std::istream::operator>>(pvVar3,&local_438);
    for (local_3e0 = 0; local_3e0 < local_438; local_3e0 = local_3e0 + 1) {
      plVar4 = TPZVec<long>::operator[](&local_458,local_3e0);
      std::istream::operator>>(local_2a8,plVar4);
    }
    if (local_438 == 3) {
      for (local_3e0 = 0; local_3e0 < local_438; local_3e0 = local_3e0 + 1) {
        plVar4 = TPZVec<long>::operator[](&local_458,local_3e0);
        plVar4 = TPZVec<long>::operator[](local_90,*plVar4 + -1);
        lVar1 = *plVar4;
        plVar4 = TPZVec<long>::operator[](&local_408,local_3e0);
        *plVar4 = lVar1;
      }
      TPZVec<long>::Resize
                ((TPZVec<long> *)in_stack_fffffffffffffa70,(int64_t)in_stack_fffffffffffffa68);
      (**(code **)(**(long **)(in_RDI + 0x208) + 0x60))
                (*(long **)(in_RDI + 0x208),2,&local_408,1,local_410);
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
      TPZStack<TPZGeoElSide,_10>::Push
                ((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffa50,
                 (TPZGeoElSide *)in_stack_fffffffffffffa48);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e30a85);
    }
    else if ((local_438 == 4) && (local_420 != 4)) {
      TPZVec<long>::Resize
                ((TPZVec<long> *)in_stack_fffffffffffffa70,(int64_t)in_stack_fffffffffffffa68);
      for (local_3e0 = 0; local_3e0 < local_438; local_3e0 = local_3e0 + 1) {
        plVar4 = TPZVec<long>::operator[](&local_458,local_3e0);
        plVar4 = TPZVec<long>::operator[](local_90,*plVar4 + -1);
        lVar1 = *plVar4;
        plVar4 = TPZVec<long>::operator[](&local_408,local_3e0);
        *plVar4 = lVar1;
      }
      (**(code **)(**(long **)(in_RDI + 0x208) + 0x60))
                (*(long **)(in_RDI + 0x208),3,&local_408,1,local_410);
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
      TPZStack<TPZGeoElSide,_10>::Push
                ((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffa50,
                 (TPZGeoElSide *)in_stack_fffffffffffffa48);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e30c28);
    }
    else if ((local_438 == 4) && (local_420 == 4)) {
      TPZVec<long>::Resize
                ((TPZVec<long> *)in_stack_fffffffffffffa70,(int64_t)in_stack_fffffffffffffa68);
      for (local_3e0 = 0; local_3e0 < local_438; local_3e0 = local_3e0 + 1) {
        plVar4 = TPZVec<long>::operator[](&local_458,local_3e0);
        plVar4 = TPZVec<long>::operator[](local_90,*plVar4 + -1);
        lVar1 = *plVar4;
        plVar4 = TPZVec<long>::operator[](&local_408,local_3e0);
        *plVar4 = lVar1;
      }
      in_stack_fffffffffffffa70 = local_18;
      (**(code **)(**(long **)(in_RDI + 0x208) + 0x60))
                (*(long **)(in_RDI + 0x208),4,&local_408,1,local_410);
      TPZStack<TPZGeoEl_*,_10>::Push
                ((TPZStack<TPZGeoEl_*,_10> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    }
    else if (local_438 == 8) {
      TPZVec<long>::Resize
                ((TPZVec<long> *)in_stack_fffffffffffffa70,(int64_t)in_stack_fffffffffffffa68);
      for (local_3e0 = 0; local_3e0 < local_438; local_3e0 = local_3e0 + 1) {
        in_stack_fffffffffffffa68 = TPZVec<long>::operator[](&local_458,local_3e0);
        plVar4 = TPZVec<long>::operator[](local_90,*in_stack_fffffffffffffa68 + -1);
        in_stack_fffffffffffffa50 = (TPZGeoNode *)*plVar4;
        plVar4 = TPZVec<long>::operator[](&local_408,local_3e0);
        *plVar4 = (long)in_stack_fffffffffffffa50;
      }
      in_stack_fffffffffffffa40 = local_18;
      in_stack_fffffffffffffa48 =
           (TPZGeoEl *)
           (**(code **)(**(long **)(in_RDI + 0x208) + 0x60))
                     (*(long **)(in_RDI + 0x208),7,&local_408,1,local_410);
      TPZStack<TPZGeoEl_*,_10>::Push
                ((TPZStack<TPZGeoEl_*,_10> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    }
  }
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa40,
                  in_stack_fffffffffffffa38);
  std::ifstream::close();
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffa40);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffa40);
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffa40);
  std::ifstream::~ifstream(local_2a8);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1e30f45);
  return;
}

Assistant:

void TPZGMSHReadMesh::ReadMesh3D(char *meshfile,TPZStack<TPZGeoEl *> &elemlist,TPZStack<TPZGeoElSide> &elembclist){
	
	//o GMSH pode não retornar os nós sequencialmente
	//nesse casso deveram ser resequenciados
	TPZStack<int64_t> Indexes;
	Resequence(Indexes,meshfile);
	std::ifstream mesh(meshfile);
	char title[256];
	int64_t nnodes,number;
	mesh >> title;//$NOD
	mesh >> nnodes;
	fGeoMesh->NodeVec().Resize(nnodes);   
	TPZVec<REAL> coord(3);
	int64_t i;
	for(i=0;i<nnodes;i++){
		mesh >> number;
		mesh >> coord[0] >> coord[1] >> coord[2];
		fGeoMesh->NodeVec()[i].Initialize(coord,*fGeoMesh);
	}
	mesh >> title;//$ENDNOD
	mesh >> title;//$ELM
	int64_t numelem;
	mesh >> numelem;
	TPZVec<int64_t> nodes;
	nodes.Resize(3);
	int64_t index;
	int64_t numb,fgt1,nmat,fgt2,nvert;
	TPZVec<int64_t> nos(8);//máximo do cubo
	for(i=0;i<numelem;i++){
		mesh >> numb >> fgt1 >> nmat >> fgt2 >> nvert;
		for(i=0;i<nvert;i++) mesh >> nos[i];
		if(nvert == 3){//triângulos
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			nodes.Resize(3);
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(ETriangle,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 != 4){//quadrilateros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(EQuadrilateral,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 == 4){//tetraedros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ETetraedro,nodes,1,index));
			continue;
		} else if(nvert == 8){//hexaedros
			nodes.Resize(8);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ECube,nodes,1,index));
			continue;
		}
	}
	mesh >> title;//$ENDELM
	mesh.close();
}